

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::set_allocated_objects
          (VisionFeaturePrint *this,VisionFeaturePrint_Objects *objects)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_VisionFeaturePrintType(this);
  if (objects != (VisionFeaturePrint_Objects *)0x0) {
    submessage_arena =
         google::protobuf::internal::InternalMetadata::owning_arena
                   (&(objects->super_MessageLite)._internal_metadata_);
    if (message_arena != submessage_arena) {
      objects = (VisionFeaturePrint_Objects *)
                google::protobuf::internal::GetOwnedMessageInternal
                          (message_arena,&objects->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 0x15;
    (this->VisionFeaturePrintType_).objects_ = objects;
  }
  return;
}

Assistant:

void VisionFeaturePrint::set_allocated_objects(::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects* objects) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_VisionFeaturePrintType();
  if (objects) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects>::GetOwningArena(objects);
    if (message_arena != submessage_arena) {
      objects = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, objects, submessage_arena);
    }
    set_has_objects();
    VisionFeaturePrintType_.objects_ = objects;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.CoreMLModels.VisionFeaturePrint.objects)
}